

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::IntermediateNode::
loadChildren(IntermediateNode *this,NodeIterator *children)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
  *pIVar3;
  Top TVar4;
  
  pIVar3 = children->_core;
  while( true ) {
    iVar2 = (*pIVar3->_vptr_IteratorCore[2])();
    if ((char)iVar2 == '\0') break;
    iVar2 = (*children->_core->_vptr_IteratorCore[3])();
    lVar1 = *(long *)CONCAT44(extraout_var,iVar2);
    TVar4 = Kernel::TermList::top((TermList *)(lVar1 + 8));
    iVar2 = (*(this->super_Node)._vptr_Node[10])
                      (this,TVar4._inner._inner._0_8_,(ulong)(TVar4._inner._inner._8_4_ & 0xff),1);
    *(long *)CONCAT44(extraout_var_00,iVar2) = lVar1;
    pIVar3 = children->_core;
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::IntermediateNode::loadChildren(NodeIterator children)
{
  while(children.hasNext()) {
    Node* ext=*children.next();
    Node** own=childByTop(ext->top(), true);
    ASS(! *own);
    *own=ext;
  }
}